

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_classtrait.cpp
# Opt level: O2

void __thiscall
pfederc::Parser::parseClassTraitBody
          (Parser *this,bool *err,
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *functions)

{
  bool bVar1;
  pointer __p;
  _Head_base<0UL,_pfederc::FuncExpr_*,_false> _Var2;
  undefined1 local_78 [16];
  _Head_base<0UL,_pfederc::FuncExpr_*,_false> local_68;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  *local_60;
  pointer local_58;
  unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> local_50;
  unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> funcExpr;
  undefined1 local_40 [16];
  
  local_58 = (pointer)&PTR__FuncExpr_0012b790;
  local_60 = functions;
  while( true ) {
    bVar1 = Token::operator!=(this->lexer->currentToken,TOK_STMT);
    if (!bVar1) {
      return;
    }
    bVar1 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
    if (!bVar1) break;
    bVar1 = Token::operator==(this->lexer->currentToken,TOK_EOL);
    if (bVar1) {
      Lexer::next(this->lexer);
    }
    else {
      parseExpression((Parser *)&local_68,(Precedence)this);
      _Var2._M_head_impl = local_68._M_head_impl;
      if ((_Tuple_impl<0UL,_pfederc::FuncExpr_*,_std::default_delete<pfederc::FuncExpr>_>)
          local_68._M_head_impl != (FuncExpr *)0x0) {
        if (*(int *)((long)local_68._M_head_impl + 0x18) == 4) {
          local_68._M_head_impl = (FuncExpr *)0x0;
          if (*(pointer *)_Var2._M_head_impl != local_58) {
            _Var2._M_head_impl = (FuncExpr *)0x0;
          }
          funcExpr._M_t.
          super___uniq_ptr_impl<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>._M_t.
          super__Tuple_impl<0UL,_pfederc::FuncExpr_*,_std::default_delete<pfederc::FuncExpr>_>.
          super__Head_base<0UL,_pfederc::FuncExpr_*,_false>._M_head_impl =
               (__uniq_ptr_data<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>,_true,_true>
                )(__uniq_ptr_data<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>,_true,_true>
                  )_Var2;
          if (*(long *)&(_Var2._M_head_impl)->body == 0) {
            local_78._6_2_ = 2;
            local_78._0_4_ = STX_ERR_TRAITCLASS_SCOPE_FUNC_BODY;
            std::
            make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                      ((Level *)(local_78 + 8),(SyntaxErrorCode *)(local_78 + 6),
                       (Position *)local_78);
            generateError((Parser *)&local_50,
                          (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)this);
            std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
            ~unique_ptr(&local_50);
            std::
            unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
            ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)(local_78 + 8));
          }
          std::__cxx11::
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          ::push_back(local_60,(value_type *)&funcExpr);
          std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::~unique_ptr
                    (&funcExpr);
        }
        else {
          local_78._0_2_ = 2;
          local_78._8_4_ = 0x16;
          std::
          make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                    ((Level *)&funcExpr,(SyntaxErrorCode *)local_78,(Position *)(local_78 + 8));
          generateError((Parser *)(local_40 + 8),
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     (local_40 + 8));
          std::
          unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)&funcExpr);
        }
      }
      bVar1 = expect(this,TOK_EOL);
      if (!bVar1) {
        local_78._0_2_ = 2;
        local_78._8_4_ = 0xf;
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)&funcExpr,(SyntaxErrorCode *)local_78,(Position *)(local_78 + 8));
        generateError((Parser *)local_40,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   local_40);
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)&funcExpr);
        skipToStmtEol(this);
      }
      if (local_68._M_head_impl != (FuncExpr *)0x0) {
        (*((local_68._M_head_impl)->super_Expr)._vptr_Expr[1])();
      }
    }
  }
  return;
}

Assistant:

void Parser::parseClassTraitBody(bool &err,
    std::list<std::unique_ptr<FuncExpr>> &functions) noexcept {
  while (*lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next();
      continue;
    }

    std::unique_ptr<Expr> expr(parseExpression());
    if (expr && expr->getType() == ExprType::EXPR_FUNC) {
      std::unique_ptr<FuncExpr> funcExpr(
            dynamic_cast<FuncExpr*>(expr.release()));

      /*if (funcExpr->getTemplates()) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_TRAIT_SCOPE_FUNC_TEMPL,
              std::get<0>(funcExpr->getTemplates()->front())->getPosition()
              + std::get<1>(funcExpr->getTemplates()->back())->getPosition()));
      }*/

      if (!funcExpr->getBody()) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_TRAITCLASS_SCOPE_FUNC_BODY,
              funcExpr->getPosition()));
      }

      functions.push_back(std::move(funcExpr));
    } else if (expr) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR, 
            SyntaxErrorCode::STX_ERR_TRAIT_SCOPE, expr->getPosition()));
      // soft error
    }

    if (!expect(TokenType::TOK_EOL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      // soft error
      skipToStmtEol();
    }
  }
}